

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> * __thiscall
kj::ArrayBuilder<const_void_*>::operator=
          (ArrayBuilder<const_void_*> *this,
          ArrayBuilder<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *other)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = *(long *)this;
  if (lVar1 != 0) {
    lVar2 = *(long *)(this + 8);
    lVar3 = *(long *)(this + 0x10);
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    *(undefined8 *)(this + 0x10) = 0;
    (**(code **)**(undefined8 **)(this + 0x18))
              (*(undefined8 **)(this + 0x18),lVar1,8,lVar2 - lVar1 >> 3,lVar3 - lVar1 >> 3,0);
  }
  *(Entry **)this = other->ptr;
  *(RemoveConst<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> **)(this + 8) =
       other->pos;
  *(Entry **)(this + 0x10) = other->endPtr;
  *(ArrayDisposer **)(this + 0x18) = other->disposer;
  other->ptr = (Entry *)0x0;
  other->pos = (RemoveConst<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *)0x0;
  other->endPtr = (Entry *)0x0;
  return (ArrayBuilder<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *)this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }